

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O0

void __thiscall icu_63::FCDUIterCollationIterator::switchToForward(FCDUIterCollationIterator *this)

{
  int32_t iVar1;
  FCDUIterCollationIterator *this_local;
  
  if (this->state == ITER_CHECK_BWD) {
    iVar1 = (*((this->super_UIterCollationIterator).iter)->getIndex)
                      ((this->super_UIterCollationIterator).iter,UITER_CURRENT);
    this->pos = iVar1;
    this->start = iVar1;
    if (this->pos == this->limit) {
      this->state = ITER_CHECK_FWD;
    }
    else {
      this->state = ITER_IN_FCD_SEGMENT;
    }
  }
  else {
    if (this->state != ITER_IN_FCD_SEGMENT) {
      if (this->state == IN_NORM_ITER_AT_START) {
        (*((this->super_UIterCollationIterator).iter)->move)
                  ((this->super_UIterCollationIterator).iter,this->limit - this->start,UITER_CURRENT
                  );
      }
      this->start = this->limit;
    }
    this->state = ITER_CHECK_FWD;
  }
  return;
}

Assistant:

void
FCDUIterCollationIterator::switchToForward() {
    U_ASSERT(state == ITER_CHECK_BWD ||
             (state == ITER_IN_FCD_SEGMENT && pos == limit) ||
             (state >= IN_NORM_ITER_AT_LIMIT && pos == normalized.length()));
    if(state == ITER_CHECK_BWD) {
        // Turn around from backward checking.
        start = pos = iter.getIndex(&iter, UITER_CURRENT);
        if(pos == limit) {
            state = ITER_CHECK_FWD;  // Check forward.
        } else {  // pos < limit
            state = ITER_IN_FCD_SEGMENT;  // Stay in FCD segment.
        }
    } else {
        // Reached the end of the FCD segment.
        if(state == ITER_IN_FCD_SEGMENT) {
            // The input text segment is FCD, extend it forward.
        } else {
            // The input text segment needed to be normalized.
            // Switch to checking forward from it.
            if(state == IN_NORM_ITER_AT_START) {
                iter.move(&iter, limit - start, UITER_CURRENT);
            }
            start = limit;
        }
        state = ITER_CHECK_FWD;
    }
}